

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_source_get_length_in_pcm_frames(ma_data_source *pDataSource,ma_uint64 *pLength)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) && (*pLength = 0, pDataSource != (ma_data_source *)0x0)) {
    if (*(long *)((long)pDataSource + 0x10) != -1) {
      *pLength = *(long *)((long)pDataSource + 0x10) - *(long *)((long)pDataSource + 8);
      return MA_SUCCESS;
    }
    if (*(code **)(*pDataSource + 0x20) != (code *)0x0) {
      mVar1 = (**(code **)(*pDataSource + 0x20))();
      return mVar1;
    }
    mVar1 = MA_NOT_IMPLEMENTED;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_get_length_in_pcm_frames(ma_data_source* pDataSource, ma_uint64* pLength)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ASSERT(pDataSourceBase->vtable != NULL);

    /*
    If we have a range defined we'll use that to determine the length. This is one of rare times
    where we'll actually trust the caller. If they've set the range, I think it's mostly safe to
    assume they've set it based on some higher level knowledge of the structure of the sound bank.
    */
    if (pDataSourceBase->rangeEndInFrames != ~((ma_uint64)0)) {
        *pLength = pDataSourceBase->rangeEndInFrames - pDataSourceBase->rangeBegInFrames;
        return MA_SUCCESS;
    }

    /*
    Getting here means a range is not defined so we'll need to get the data source itself to tell
    us the length.
    */
    if (pDataSourceBase->vtable->onGetLength == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pDataSourceBase->vtable->onGetLength(pDataSource, pLength);
}